

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::ExtractSubrange
          (RepeatedField<int> *this,int start,int num,int *elements)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  if (0 < num && elements != (int *)0x0) {
    pvVar1 = this->arena_or_elements_;
    uVar4 = 0;
    do {
      elements[uVar4] = *(int *)((long)pvVar1 + uVar4 * 4 + (long)start * 4);
      uVar4 = uVar4 + 1;
    } while ((uint)num != uVar4);
  }
  if (0 < num) {
    iVar2 = this->current_size_;
    if (start + num < iVar2) {
      pvVar1 = this->arena_or_elements_;
      lVar3 = (long)(start + num);
      do {
        *(undefined4 *)((long)pvVar1 + lVar3 * 4 + (ulong)(uint)num * -4) =
             *(undefined4 *)((long)pvVar1 + lVar3 * 4);
        lVar3 = lVar3 + 1;
        iVar2 = this->current_size_;
      } while (lVar3 < iVar2);
    }
    if (0 < iVar2) {
      this->current_size_ = iVar2 - num;
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::ExtractSubrange(int start, int num,
                                             Element* elements) {
  GOOGLE_DCHECK_GE(start, 0);
  GOOGLE_DCHECK_GE(num, 0);
  GOOGLE_DCHECK_LE(start + num, this->current_size_);

  // Save the values of the removed elements if requested.
  if (elements != NULL) {
    for (int i = 0; i < num; ++i) elements[i] = this->Get(i + start);
  }

  // Slide remaining elements down to fill the gap.
  if (num > 0) {
    for (int i = start + num; i < this->current_size_; ++i)
      this->Set(i - num, this->Get(i));
    this->Truncate(this->current_size_ - num);
  }
}